

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::FormatString<char[22],unsigned_int,char[21],char_const*,char[70],unsigned_int,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [22],uint *Args_1,
          char (*Args_2) [21],char **Args_3,char (*Args_4) [70],uint *Args_5,char (*Args_6) [2])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[22],unsigned_int,char[21],char_const*,char[70],unsigned_int,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [22])this,(uint *)Args,(char (*) [21])Args_1,(char **)Args_2,
             (char (*) [70])Args_3,(uint *)Args_4,(char (*) [2])Args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}